

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O1

int isoent_tree(archive_write *a,isoent **isoentpp)

{
  iso9660_conflict *iso9660;
  isoent *child;
  size_t sVar1;
  isofile *piVar2;
  isofile *piVar3;
  bool bVar4;
  archive_string *dest;
  int iVar5;
  uint uVar6;
  mode_t mVar7;
  mode_t mVar8;
  isoent *piVar9;
  isoent *child_00;
  char *pcVar10;
  char *in_RDX;
  char *extraout_RDX;
  char *fn;
  char *fn_00;
  char *pcVar11;
  long lVar12;
  char name [256];
  archive_string local_168;
  isoent *local_150;
  archive_string *local_148;
  char *local_140;
  char local_138 [264];
  
  iso9660 = (iso9660_conflict *)a->format_data;
  child = *isoentpp;
  sVar1 = (child->file->parentdir).length;
  if (sVar1 == 0) {
    pcVar11 = "";
  }
  else {
    pcVar11 = (child->file->parentdir).s;
  }
  child_00 = (iso9660->primary).rootent;
  if (((iso9660->cur_dirstr).length == sVar1) &&
     (iVar5 = strcmp((iso9660->cur_dirstr).s,pcVar11), in_RDX = extraout_RDX, iVar5 == 0)) {
    iVar5 = isoent_add_child_tail(iso9660->cur_dirent,child);
    if (iVar5 != 0) {
      return 0;
    }
    child_00 = iso9660->cur_dirent;
  }
  else {
    local_148 = &iso9660->cur_dirstr;
    uVar6 = get_path_component(local_138,(size_t)pcVar11,in_RDX);
    local_140 = pcVar11;
    if (uVar6 == 0) {
      piVar9 = (isoent *)0x0;
    }
    else {
      do {
        if ((int)uVar6 < 0) {
          archive_set_error(&a->archive,-1,"A name buffer is too small");
          _isoent_free(child);
          return -0x1e;
        }
        piVar9 = (isoent *)__archive_rb_tree_find_node(&child_00->rbtree,local_138);
        if (piVar9 == (isoent *)0x0) break;
        if (*pcVar11 == '\0') goto LAB_00146c1e;
        if ((piVar9->field_0xe8 & 2) == 0) {
          pcVar11 = archive_entry_pathname(piVar9->file->entry);
          pcVar10 = archive_entry_pathname(child->file->entry);
          archive_set_error(&a->archive,-1,"`%s\' is not directory, we cannot insert `%s\' ",pcVar11
                            ,pcVar10);
          goto LAB_00146f27;
        }
        pcVar11 = pcVar11 + (ulong)(pcVar11[uVar6] == '/') + (ulong)uVar6;
        uVar6 = get_path_component(local_138,(size_t)pcVar11,fn);
        child_00 = piVar9;
      } while (uVar6 != 0);
      piVar9 = (isoent *)0x0;
    }
LAB_00146c1e:
    if (piVar9 != (isoent *)0x0) goto LAB_00146eb6;
    while (dest = local_148, *pcVar11 != '\0') {
      lVar12 = (long)(int)uVar6;
      local_168.s = (char *)0x0;
      local_168.length = 0;
      local_168.buffer_length = 0;
      local_150 = child_00;
      archive_strncat(&local_168,local_140,(size_t)(pcVar11 + (lVar12 - (long)local_140)));
      if (local_168.s[local_168.length - 1] == '/') {
        local_168.s[local_168.length - 1] = '\0';
        local_168.length = local_168.length - 1;
      }
      child_00 = isoent_create_virtual_dir(a,iso9660,local_168.s);
      archive_string_free(&local_168);
      piVar9 = local_150;
      if (child_00 == (isoent *)0x0) {
        archive_set_error(&a->archive,0xc,"Can\'t allocate memory");
        child_00 = local_150;
LAB_00146d47:
        _isoent_free(child);
        *isoentpp = (isoent *)0x0;
        bVar4 = false;
      }
      else {
        iVar5 = child_00->file->dircnt;
        if (iso9660->dircnt_max < iVar5) {
          iso9660->dircnt_max = iVar5;
        }
        isoent_add_child_tail(local_150,child_00);
        pcVar11 = pcVar11 + (ulong)(pcVar11[lVar12] == '/') + lVar12;
        uVar6 = get_path_component(local_138,(size_t)pcVar11,fn_00);
        if ((int)uVar6 < 0) {
          archive_string_free(&local_168);
          uVar6 = 0xffffffff;
          archive_set_error(&a->archive,-1,"A name buffer is too small");
          child_00 = piVar9;
          goto LAB_00146d47;
        }
        bVar4 = true;
      }
      if (!bVar4) {
        return -0x1e;
      }
    }
    iso9660->cur_dirent = child_00;
    (iso9660->cur_dirstr).length = 0;
    archive_string_ensure
              (local_148,(child_00->file->parentdir).length + (child_00->file->basename).length + 2)
    ;
    piVar2 = child_00->file;
    sVar1 = (piVar2->parentdir).length;
    if ((piVar2->basename).length + sVar1 == 0) {
      *dest->s = '\0';
    }
    else {
      if (sVar1 != 0) {
        (iso9660->cur_dirstr).length = 0;
        archive_string_concat(dest,&piVar2->parentdir);
        archive_strappend_char(dest,'/');
      }
      archive_string_concat(dest,&child_00->file->basename);
    }
    iVar5 = isoent_add_child_tail(child_00,child);
    if (iVar5 != 0) {
      return 0;
    }
  }
  piVar9 = (isoent *)__archive_rb_tree_find_node(&child_00->rbtree,(child->file->basename).s);
LAB_00146eb6:
  piVar2 = piVar9->file;
  piVar3 = child->file;
  mVar7 = archive_entry_filetype(piVar2->entry);
  mVar8 = archive_entry_filetype(piVar3->entry);
  if (mVar7 == mVar8) {
    piVar9->file = piVar3;
    child->file = piVar2;
    piVar9->field_0xe8 = piVar9->field_0xe8 & 0xfe;
    _isoent_free(child);
    *isoentpp = piVar9;
    return 0;
  }
  pcVar11 = archive_entry_pathname(piVar2->entry);
  archive_set_error(&a->archive,-1,"Found duplicate entries `%s\' and its file type is different",
                    pcVar11);
LAB_00146f27:
  _isoent_free(child);
  *isoentpp = (isoent *)0x0;
  return -0x19;
}

Assistant:

static int
isoent_tree(struct archive_write *a, struct isoent **isoentpp)
{
#if defined(_WIN32) && !defined(__CYGWIN__)
	char name[_MAX_FNAME];/* Included null terminator size. */
#elif defined(NAME_MAX) && NAME_MAX >= 255
	char name[NAME_MAX+1];
#else
	char name[256];
#endif
	struct iso9660 *iso9660 = a->format_data;
	struct isoent *dent, *isoent, *np;
	struct isofile *f1, *f2;
	const char *fn, *p;
	int l;

	isoent = *isoentpp;
	dent = iso9660->primary.rootent;
	if (isoent->file->parentdir.length > 0)
		fn = p = isoent->file->parentdir.s;
	else
		fn = p = "";

	/*
	 * If the path of the parent directory of `isoent' entry is
	 * the same as the path of `cur_dirent', add isoent to
	 * `cur_dirent'.
	 */
	if (archive_strlen(&(iso9660->cur_dirstr))
	      == archive_strlen(&(isoent->file->parentdir)) &&
	    strcmp(iso9660->cur_dirstr.s, fn) == 0) {
		if (!isoent_add_child_tail(iso9660->cur_dirent, isoent)) {
			np = (struct isoent *)__archive_rb_tree_find_node(
			    &(iso9660->cur_dirent->rbtree),
			    isoent->file->basename.s);
			goto same_entry;
		}
		return (ARCHIVE_OK);
	}

	for (;;) {
		l = get_path_component(name, sizeof(name), fn);
		if (l == 0) {
			np = NULL;
			break;
		}
		if (l < 0) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_MISC,
			    "A name buffer is too small");
			_isoent_free(isoent);
			return (ARCHIVE_FATAL);
		}

		np = isoent_find_child(dent, name);
		if (np == NULL || fn[0] == '\0')
			break;

		/* Find next subdirectory. */
		if (!np->dir) {
			/* NOT Directory! */
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_MISC,
			    "`%s' is not directory, we cannot insert `%s' ",
			    archive_entry_pathname(np->file->entry),
			    archive_entry_pathname(isoent->file->entry));
			_isoent_free(isoent);
			*isoentpp = NULL;
			return (ARCHIVE_FAILED);
		}
		fn += l;
		if (fn[0] == '/')
			fn++;
		dent = np;
	}
	if (np == NULL) {
		/*
		 * Create virtual parent directories.
		 */
		while (fn[0] != '\0') {
			struct isoent *vp;
			struct archive_string as;

			archive_string_init(&as);
			archive_strncat(&as, p, fn - p + l);
			if (as.s[as.length-1] == '/') {
				as.s[as.length-1] = '\0';
				as.length--;
			}
			vp = isoent_create_virtual_dir(a, iso9660, as.s);
			if (vp == NULL) {
				archive_string_free(&as);
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate memory");
				_isoent_free(isoent);
				*isoentpp = NULL;
				return (ARCHIVE_FATAL);
			}
			archive_string_free(&as);

			if (vp->file->dircnt > iso9660->dircnt_max)
				iso9660->dircnt_max = vp->file->dircnt;
			isoent_add_child_tail(dent, vp);
			np = vp;

			fn += l;
			if (fn[0] == '/')
				fn++;
			l = get_path_component(name, sizeof(name), fn);
			if (l < 0) {
				archive_string_free(&as);
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_MISC,
				    "A name buffer is too small");
				_isoent_free(isoent);
				*isoentpp = NULL;
				return (ARCHIVE_FATAL);
			}
			dent = np;
		}

		/* Found out the parent directory where isoent can be
		 * inserted. */
		iso9660->cur_dirent = dent;
		archive_string_empty(&(iso9660->cur_dirstr));
		archive_string_ensure(&(iso9660->cur_dirstr),
		    archive_strlen(&(dent->file->parentdir)) +
		    archive_strlen(&(dent->file->basename)) + 2);
		if (archive_strlen(&(dent->file->parentdir)) +
		    archive_strlen(&(dent->file->basename)) == 0)
			iso9660->cur_dirstr.s[0] = 0;
		else {
			if (archive_strlen(&(dent->file->parentdir)) > 0) {
				archive_string_copy(&(iso9660->cur_dirstr),
				    &(dent->file->parentdir));
				archive_strappend_char(&(iso9660->cur_dirstr), '/');
			}
			archive_string_concat(&(iso9660->cur_dirstr),
			    &(dent->file->basename));
		}

		if (!isoent_add_child_tail(dent, isoent)) {
			np = (struct isoent *)__archive_rb_tree_find_node(
			    &(dent->rbtree), isoent->file->basename.s);
			goto same_entry;
		}
		return (ARCHIVE_OK);
	}

same_entry:
	/*
	 * We have already has the entry the filename of which is
	 * the same.
	 */
	f1 = np->file;
	f2 = isoent->file;

	/* If the file type of entries is different,
	 * we cannot handle it. */
	if (archive_entry_filetype(f1->entry) !=
	    archive_entry_filetype(f2->entry)) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Found duplicate entries `%s' and its file type is "
		    "different",
		    archive_entry_pathname(f1->entry));
		_isoent_free(isoent);
		*isoentpp = NULL;
		return (ARCHIVE_FAILED);
	}

	/* Swap file entries. */
	np->file = f2;
	isoent->file = f1;
	np->virtual = 0;

	_isoent_free(isoent);
	*isoentpp = np;
	return (ARCHIVE_OK);
}